

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O3

Status __thiscall
spvtools::opt::TrimCapabilitiesPass::TrimUnrequiredExtensions
          (TrimCapabilitiesPass *this,ExtensionSet *required_extensions)

{
  CapabilitySet *this_00;
  ExtensionSet *this_01;
  bool bVar1;
  Capability operand;
  spv_result_t sVar2;
  Extension value;
  Status SVar3;
  long lVar4;
  byte bVar5;
  ulong uVar6;
  size_t sVar7;
  CapabilitySet *__range2;
  spv_operand_desc_t *desc;
  iterator __begin2;
  iterator __begin2_1;
  ExtensionSet supported_extensions;
  spv_operand_desc local_b8;
  size_t local_b0;
  IRContext *local_a8;
  iterator local_a0;
  ExtensionSet *local_88;
  TrimCapabilitiesPass *local_80;
  pair<spvtools::EnumSet<spvtools::Extension>::Iterator,_bool> local_78;
  EnumSet<spvtools::Extension> local_58;
  
  this_00 = &this->supportedCapabilities_;
  local_a8 = (this->super_Pass).context_;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.size_ = 0;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.buckets_.
  super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8 = (spv_operand_desc)0x0;
  local_88 = required_extensions;
  EnumSet<spv::Capability>::cbegin(&local_a0,this_00);
  local_b0 = (long)(this->supportedCapabilities_).buckets_.
                   super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->supportedCapabilities_).buckets_.
                   super__Vector_base<spvtools::EnumSet<spv::Capability>::Bucket,_std::allocator<spvtools::EnumSet<spv::Capability>::Bucket>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
  local_80 = this;
  if (((local_a0.set_ != this_00) || (local_a0.bucketOffset_ != 0)) ||
     (local_a0.bucketIndex_ != local_b0)) {
    local_a8 = (IRContext *)&local_a8->grammar_;
    do {
      operand = EnumSet<spv::Capability>::Iterator::operator*(&local_a0);
      sVar2 = AssemblyGrammar::lookupOperand
                        ((AssemblyGrammar *)local_a8,SPV_OPERAND_TYPE_CAPABILITY,operand,&local_b8);
      if ((sVar2 == SPV_SUCCESS) && (local_b8->numExtensions != 0)) {
        lVar4 = 0;
        uVar6 = 0;
        do {
          EnumSet<spvtools::Extension>::insert
                    (&local_78,&local_58,(Extension *)((long)local_b8->extensions + lVar4));
          uVar6 = uVar6 + 1;
          lVar4 = lVar4 + 4;
        } while (uVar6 < local_b8->numExtensions);
      }
      EnumSet<spv::Capability>::Iterator::operator++(&local_a0);
    } while (((local_a0.set_ != this_00) || (local_a0.bucketOffset_ != 0)) ||
            (local_a0.bucketIndex_ != local_b0));
  }
  EnumSet<spvtools::Extension>::cbegin(&local_78.first,&local_58);
  this_01 = local_88;
  sVar7 = (long)local_58.buckets_.
                super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_58.buckets_.
                super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (((local_78.first.set_ != &local_58) || (local_78.first.bucketOffset_ != 0)) ||
     (SVar3 = SuccessWithoutChange, local_78.first.bucketIndex_ != sVar7)) {
    bVar5 = 0;
    do {
      value = EnumSet<spvtools::Extension>::Iterator::operator*(&local_78.first);
      bVar1 = EnumSet<spvtools::Extension>::contains(this_01,value);
      if (!bVar1) {
        bVar1 = IRContext::RemoveExtension((local_80->super_Pass).context_,value);
        bVar5 = bVar5 | bVar1;
      }
      EnumSet<spvtools::Extension>::Iterator::operator++(&local_78.first);
    } while (((local_78.first.set_ != &local_58) || (local_78.first.bucketOffset_ != 0)) ||
            (local_78.first.bucketIndex_ != sVar7));
    SVar3 = bVar5 ^ SuccessWithoutChange;
  }
  if (local_58.buckets_.
      super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.buckets_.
                    super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.buckets_.
                          super__Vector_base<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return SVar3;
}

Assistant:

Pass::Status TrimCapabilitiesPass::TrimUnrequiredExtensions(
    const ExtensionSet& required_extensions) const {
  const auto supported_extensions =
      getExtensionsRelatedTo(supportedCapabilities_, context()->grammar());

  bool modified_module = false;
  for (auto extension : supported_extensions) {
    if (required_extensions.contains(extension)) {
      continue;
    }

    if (context()->RemoveExtension(extension)) {
      modified_module = true;
    }
  }

  return modified_module ? Pass::Status::SuccessWithChange
                         : Pass::Status::SuccessWithoutChange;
}